

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O1

void __thiscall cmTarget::SetMakefile(cmTarget *this,cmMakefile *mf)

{
  cmMakefile *pcVar1;
  cmTargetInternals *pcVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  char *pcVar6;
  undefined **ppuVar7;
  pointer s;
  cmStringRange cVar8;
  cmBacktraceRange cVar9;
  string configUpper;
  string property;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configNames;
  cmListFileBacktrace local_f8;
  allocator local_b1;
  cmTarget *local_b0;
  string local_a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  string local_70;
  string local_50;
  
  this->Makefile = mf;
  local_f8.Context.Name._M_dataplus._M_p = (pointer)&local_f8.Context.Name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"WIN32","");
  bVar3 = cmMakefile::IsOn(mf,(string *)&local_f8);
  local_b0 = this;
  if (!bVar3) {
    pcVar1 = this->Makefile;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"CYGWIN","");
    bVar4 = cmMakefile::IsOn(pcVar1,&local_70);
    if (!bVar4) {
      pcVar1 = this->Makefile;
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"MINGW","");
      bVar4 = cmMakefile::IsOn(pcVar1,&local_a8);
      local_b0->DLLPlatform = bVar4;
      this = local_b0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
        this = local_b0;
      }
      goto LAB_00362ee5;
    }
  }
  this->DLLPlatform = true;
LAB_00362ee5:
  if ((!bVar3) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2)) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8.Context.Name._M_dataplus._M_p != &local_f8.Context.Name.field_2) {
    operator_delete(local_f8.Context.Name._M_dataplus._M_p,
                    local_f8.Context.Name.field_2._M_allocated_capacity + 1);
  }
  pcVar1 = this->Makefile;
  local_f8.Context.Name._M_dataplus._M_p = (pointer)&local_f8.Context.Name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"CMAKE_SYSTEM_NAME","");
  pcVar6 = cmMakefile::GetSafeDefinition(pcVar1,(string *)&local_f8);
  iVar5 = strcmp(pcVar6,"Android");
  this->IsAndroid = iVar5 == 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8.Context.Name._M_dataplus._M_p != &local_f8.Context.Name.field_2) {
    operator_delete(local_f8.Context.Name._M_dataplus._M_p,
                    local_f8.Context.Name.field_2._M_allocated_capacity + 1);
  }
  if ((this->TargetTypeValue | SHARED_LIBRARY) != INTERFACE_LIBRARY) {
    local_f8.Context.Name._M_dataplus._M_p = (pointer)&local_f8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"ANDROID_API","");
    SetPropertyDefault(this,(string *)&local_f8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8.Context.Name._M_dataplus._M_p != &local_f8.Context.Name.field_2) {
      operator_delete(local_f8.Context.Name._M_dataplus._M_p,
                      local_f8.Context.Name.field_2._M_allocated_capacity + 1);
    }
    local_f8.Context.Name._M_dataplus._M_p = (pointer)&local_f8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"ANDROID_API_MIN","");
    SetPropertyDefault(this,(string *)&local_f8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8.Context.Name._M_dataplus._M_p != &local_f8.Context.Name.field_2) {
      operator_delete(local_f8.Context.Name._M_dataplus._M_p,
                      local_f8.Context.Name.field_2._M_allocated_capacity + 1);
    }
    local_f8.Context.Name._M_dataplus._M_p = (pointer)&local_f8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"ANDROID_ARCH","");
    SetPropertyDefault(this,(string *)&local_f8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8.Context.Name._M_dataplus._M_p != &local_f8.Context.Name.field_2) {
      operator_delete(local_f8.Context.Name._M_dataplus._M_p,
                      local_f8.Context.Name.field_2._M_allocated_capacity + 1);
    }
    local_f8.Context.Name._M_dataplus._M_p = (pointer)&local_f8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"ANDROID_STL_TYPE","");
    SetPropertyDefault(this,(string *)&local_f8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8.Context.Name._M_dataplus._M_p != &local_f8.Context.Name.field_2) {
      operator_delete(local_f8.Context.Name._M_dataplus._M_p,
                      local_f8.Context.Name.field_2._M_allocated_capacity + 1);
    }
    local_f8.Context.Name._M_dataplus._M_p = (pointer)&local_f8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"ANDROID_SKIP_ANT_STEP","");
    SetPropertyDefault(this,(string *)&local_f8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8.Context.Name._M_dataplus._M_p != &local_f8.Context.Name.field_2) {
      operator_delete(local_f8.Context.Name._M_dataplus._M_p,
                      local_f8.Context.Name.field_2._M_allocated_capacity + 1);
    }
    local_f8.Context.Name._M_dataplus._M_p = (pointer)&local_f8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"ANDROID_PROCESS_MAX","");
    SetPropertyDefault(this,(string *)&local_f8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8.Context.Name._M_dataplus._M_p != &local_f8.Context.Name.field_2) {
      operator_delete(local_f8.Context.Name._M_dataplus._M_p,
                      local_f8.Context.Name.field_2._M_allocated_capacity + 1);
    }
    local_f8.Context.Name._M_dataplus._M_p = (pointer)&local_f8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"ANDROID_PROGUARD","");
    SetPropertyDefault(this,(string *)&local_f8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8.Context.Name._M_dataplus._M_p != &local_f8.Context.Name.field_2) {
      operator_delete(local_f8.Context.Name._M_dataplus._M_p,
                      local_f8.Context.Name.field_2._M_allocated_capacity + 1);
    }
    local_f8.Context.Name._M_dataplus._M_p = (pointer)&local_f8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f8,"ANDROID_PROGUARD_CONFIG_PATH","");
    SetPropertyDefault(this,(string *)&local_f8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8.Context.Name._M_dataplus._M_p != &local_f8.Context.Name.field_2) {
      operator_delete(local_f8.Context.Name._M_dataplus._M_p,
                      local_f8.Context.Name.field_2._M_allocated_capacity + 1);
    }
    local_f8.Context.Name._M_dataplus._M_p = (pointer)&local_f8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f8,"ANDROID_SECURE_PROPS_PATH","");
    SetPropertyDefault(this,(string *)&local_f8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8.Context.Name._M_dataplus._M_p != &local_f8.Context.Name.field_2) {
      operator_delete(local_f8.Context.Name._M_dataplus._M_p,
                      local_f8.Context.Name.field_2._M_allocated_capacity + 1);
    }
    local_f8.Context.Name._M_dataplus._M_p = (pointer)&local_f8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f8,"ANDROID_NATIVE_LIB_DIRECTORIES","");
    SetPropertyDefault(this,(string *)&local_f8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8.Context.Name._M_dataplus._M_p != &local_f8.Context.Name.field_2) {
      operator_delete(local_f8.Context.Name._M_dataplus._M_p,
                      local_f8.Context.Name.field_2._M_allocated_capacity + 1);
    }
    local_f8.Context.Name._M_dataplus._M_p = (pointer)&local_f8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f8,"ANDROID_NATIVE_LIB_DEPENDENCIES","");
    SetPropertyDefault(this,(string *)&local_f8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8.Context.Name._M_dataplus._M_p != &local_f8.Context.Name.field_2) {
      operator_delete(local_f8.Context.Name._M_dataplus._M_p,
                      local_f8.Context.Name.field_2._M_allocated_capacity + 1);
    }
    local_f8.Context.Name._M_dataplus._M_p = (pointer)&local_f8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f8,"ANDROID_JAVA_SOURCE_DIR","");
    SetPropertyDefault(this,(string *)&local_f8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8.Context.Name._M_dataplus._M_p != &local_f8.Context.Name.field_2) {
      operator_delete(local_f8.Context.Name._M_dataplus._M_p,
                      local_f8.Context.Name.field_2._M_allocated_capacity + 1);
    }
    local_f8.Context.Name._M_dataplus._M_p = (pointer)&local_f8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f8,"ANDROID_JAR_DIRECTORIES","");
    SetPropertyDefault(this,(string *)&local_f8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8.Context.Name._M_dataplus._M_p != &local_f8.Context.Name.field_2) {
      operator_delete(local_f8.Context.Name._M_dataplus._M_p,
                      local_f8.Context.Name.field_2._M_allocated_capacity + 1);
    }
    local_f8.Context.Name._M_dataplus._M_p = (pointer)&local_f8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f8,"ANDROID_JAR_DEPENDENCIES","");
    SetPropertyDefault(this,(string *)&local_f8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8.Context.Name._M_dataplus._M_p != &local_f8.Context.Name.field_2) {
      operator_delete(local_f8.Context.Name._M_dataplus._M_p,
                      local_f8.Context.Name.field_2._M_allocated_capacity + 1);
    }
    local_f8.Context.Name._M_dataplus._M_p = (pointer)&local_f8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f8,"ANDROID_ASSETS_DIRECTORIES","");
    SetPropertyDefault(this,(string *)&local_f8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8.Context.Name._M_dataplus._M_p != &local_f8.Context.Name.field_2) {
      operator_delete(local_f8.Context.Name._M_dataplus._M_p,
                      local_f8.Context.Name.field_2._M_allocated_capacity + 1);
    }
    local_f8.Context.Name._M_dataplus._M_p = (pointer)&local_f8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f8,"ANDROID_ANT_ADDITIONAL_OPTIONS","");
    SetPropertyDefault(this,(string *)&local_f8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8.Context.Name._M_dataplus._M_p != &local_f8.Context.Name.field_2) {
      operator_delete(local_f8.Context.Name._M_dataplus._M_p,
                      local_f8.Context.Name.field_2._M_allocated_capacity + 1);
    }
    local_f8.Context.Name._M_dataplus._M_p = (pointer)&local_f8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"INSTALL_NAME_DIR","");
    SetPropertyDefault(this,(string *)&local_f8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8.Context.Name._M_dataplus._M_p != &local_f8.Context.Name.field_2) {
      operator_delete(local_f8.Context.Name._M_dataplus._M_p,
                      local_f8.Context.Name.field_2._M_allocated_capacity + 1);
    }
    local_f8.Context.Name._M_dataplus._M_p = (pointer)&local_f8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"INSTALL_RPATH","");
    SetPropertyDefault(this,(string *)&local_f8,"");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8.Context.Name._M_dataplus._M_p != &local_f8.Context.Name.field_2) {
      operator_delete(local_f8.Context.Name._M_dataplus._M_p,
                      local_f8.Context.Name.field_2._M_allocated_capacity + 1);
    }
    local_f8.Context.Name._M_dataplus._M_p = (pointer)&local_f8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f8,"INSTALL_RPATH_USE_LINK_PATH","");
    SetPropertyDefault(this,(string *)&local_f8,"OFF");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8.Context.Name._M_dataplus._M_p != &local_f8.Context.Name.field_2) {
      operator_delete(local_f8.Context.Name._M_dataplus._M_p,
                      local_f8.Context.Name.field_2._M_allocated_capacity + 1);
    }
    local_f8.Context.Name._M_dataplus._M_p = (pointer)&local_f8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"SKIP_BUILD_RPATH","");
    SetPropertyDefault(this,(string *)&local_f8,"OFF");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8.Context.Name._M_dataplus._M_p != &local_f8.Context.Name.field_2) {
      operator_delete(local_f8.Context.Name._M_dataplus._M_p,
                      local_f8.Context.Name.field_2._M_allocated_capacity + 1);
    }
    local_f8.Context.Name._M_dataplus._M_p = (pointer)&local_f8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f8,"BUILD_WITH_INSTALL_RPATH","");
    SetPropertyDefault(this,(string *)&local_f8,"OFF");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8.Context.Name._M_dataplus._M_p != &local_f8.Context.Name.field_2) {
      operator_delete(local_f8.Context.Name._M_dataplus._M_p,
                      local_f8.Context.Name.field_2._M_allocated_capacity + 1);
    }
    local_f8.Context.Name._M_dataplus._M_p = (pointer)&local_f8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f8,"ARCHIVE_OUTPUT_DIRECTORY","");
    SetPropertyDefault(this,(string *)&local_f8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8.Context.Name._M_dataplus._M_p != &local_f8.Context.Name.field_2) {
      operator_delete(local_f8.Context.Name._M_dataplus._M_p,
                      local_f8.Context.Name.field_2._M_allocated_capacity + 1);
    }
    local_f8.Context.Name._M_dataplus._M_p = (pointer)&local_f8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f8,"LIBRARY_OUTPUT_DIRECTORY","");
    SetPropertyDefault(this,(string *)&local_f8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8.Context.Name._M_dataplus._M_p != &local_f8.Context.Name.field_2) {
      operator_delete(local_f8.Context.Name._M_dataplus._M_p,
                      local_f8.Context.Name.field_2._M_allocated_capacity + 1);
    }
    local_f8.Context.Name._M_dataplus._M_p = (pointer)&local_f8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f8,"RUNTIME_OUTPUT_DIRECTORY","");
    SetPropertyDefault(this,(string *)&local_f8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8.Context.Name._M_dataplus._M_p != &local_f8.Context.Name.field_2) {
      operator_delete(local_f8.Context.Name._M_dataplus._M_p,
                      local_f8.Context.Name.field_2._M_allocated_capacity + 1);
    }
    local_f8.Context.Name._M_dataplus._M_p = (pointer)&local_f8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"PDB_OUTPUT_DIRECTORY","");
    SetPropertyDefault(this,(string *)&local_f8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8.Context.Name._M_dataplus._M_p != &local_f8.Context.Name.field_2) {
      operator_delete(local_f8.Context.Name._M_dataplus._M_p,
                      local_f8.Context.Name.field_2._M_allocated_capacity + 1);
    }
    local_f8.Context.Name._M_dataplus._M_p = (pointer)&local_f8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f8,"COMPILE_PDB_OUTPUT_DIRECTORY","");
    SetPropertyDefault(this,(string *)&local_f8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8.Context.Name._M_dataplus._M_p != &local_f8.Context.Name.field_2) {
      operator_delete(local_f8.Context.Name._M_dataplus._M_p,
                      local_f8.Context.Name.field_2._M_allocated_capacity + 1);
    }
    local_f8.Context.Name._M_dataplus._M_p = (pointer)&local_f8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"Fortran_FORMAT","");
    SetPropertyDefault(this,(string *)&local_f8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8.Context.Name._M_dataplus._M_p != &local_f8.Context.Name.field_2) {
      operator_delete(local_f8.Context.Name._M_dataplus._M_p,
                      local_f8.Context.Name.field_2._M_allocated_capacity + 1);
    }
    local_f8.Context.Name._M_dataplus._M_p = (pointer)&local_f8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f8,"Fortran_MODULE_DIRECTORY","");
    SetPropertyDefault(this,(string *)&local_f8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8.Context.Name._M_dataplus._M_p != &local_f8.Context.Name.field_2) {
      operator_delete(local_f8.Context.Name._M_dataplus._M_p,
                      local_f8.Context.Name.field_2._M_allocated_capacity + 1);
    }
    local_f8.Context.Name._M_dataplus._M_p = (pointer)&local_f8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"GNUtoMS","");
    SetPropertyDefault(this,(string *)&local_f8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8.Context.Name._M_dataplus._M_p != &local_f8.Context.Name.field_2) {
      operator_delete(local_f8.Context.Name._M_dataplus._M_p,
                      local_f8.Context.Name.field_2._M_allocated_capacity + 1);
    }
    local_f8.Context.Name._M_dataplus._M_p = (pointer)&local_f8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"OSX_ARCHITECTURES","");
    SetPropertyDefault(this,(string *)&local_f8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8.Context.Name._M_dataplus._M_p != &local_f8.Context.Name.field_2) {
      operator_delete(local_f8.Context.Name._M_dataplus._M_p,
                      local_f8.Context.Name.field_2._M_allocated_capacity + 1);
    }
    local_f8.Context.Name._M_dataplus._M_p = (pointer)&local_f8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"IOS_INSTALL_COMBINED","");
    SetPropertyDefault(this,(string *)&local_f8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8.Context.Name._M_dataplus._M_p != &local_f8.Context.Name.field_2) {
      operator_delete(local_f8.Context.Name._M_dataplus._M_p,
                      local_f8.Context.Name.field_2._M_allocated_capacity + 1);
    }
    local_f8.Context.Name._M_dataplus._M_p = (pointer)&local_f8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"AUTOMOC","");
    SetPropertyDefault(this,(string *)&local_f8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8.Context.Name._M_dataplus._M_p != &local_f8.Context.Name.field_2) {
      operator_delete(local_f8.Context.Name._M_dataplus._M_p,
                      local_f8.Context.Name.field_2._M_allocated_capacity + 1);
    }
    local_f8.Context.Name._M_dataplus._M_p = (pointer)&local_f8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"AUTOUIC","");
    SetPropertyDefault(this,(string *)&local_f8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8.Context.Name._M_dataplus._M_p != &local_f8.Context.Name.field_2) {
      operator_delete(local_f8.Context.Name._M_dataplus._M_p,
                      local_f8.Context.Name.field_2._M_allocated_capacity + 1);
    }
    local_f8.Context.Name._M_dataplus._M_p = (pointer)&local_f8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"AUTORCC","");
    SetPropertyDefault(this,(string *)&local_f8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8.Context.Name._M_dataplus._M_p != &local_f8.Context.Name.field_2) {
      operator_delete(local_f8.Context.Name._M_dataplus._M_p,
                      local_f8.Context.Name.field_2._M_allocated_capacity + 1);
    }
    local_f8.Context.Name._M_dataplus._M_p = (pointer)&local_f8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"AUTOMOC_MOC_OPTIONS","");
    SetPropertyDefault(this,(string *)&local_f8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8.Context.Name._M_dataplus._M_p != &local_f8.Context.Name.field_2) {
      operator_delete(local_f8.Context.Name._M_dataplus._M_p,
                      local_f8.Context.Name.field_2._M_allocated_capacity + 1);
    }
    local_f8.Context.Name._M_dataplus._M_p = (pointer)&local_f8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"AUTOUIC_OPTIONS","");
    SetPropertyDefault(this,(string *)&local_f8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8.Context.Name._M_dataplus._M_p != &local_f8.Context.Name.field_2) {
      operator_delete(local_f8.Context.Name._M_dataplus._M_p,
                      local_f8.Context.Name.field_2._M_allocated_capacity + 1);
    }
    local_f8.Context.Name._M_dataplus._M_p = (pointer)&local_f8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"AUTORCC_OPTIONS","");
    SetPropertyDefault(this,(string *)&local_f8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8.Context.Name._M_dataplus._M_p != &local_f8.Context.Name.field_2) {
      operator_delete(local_f8.Context.Name._M_dataplus._M_p,
                      local_f8.Context.Name.field_2._M_allocated_capacity + 1);
    }
    local_f8.Context.Name._M_dataplus._M_p = (pointer)&local_f8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"LINK_DEPENDS_NO_SHARED","")
    ;
    SetPropertyDefault(this,(string *)&local_f8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8.Context.Name._M_dataplus._M_p != &local_f8.Context.Name.field_2) {
      operator_delete(local_f8.Context.Name._M_dataplus._M_p,
                      local_f8.Context.Name.field_2._M_allocated_capacity + 1);
    }
    local_f8.Context.Name._M_dataplus._M_p = (pointer)&local_f8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f8,"LINK_INTERFACE_LIBRARIES","");
    SetPropertyDefault(this,(string *)&local_f8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8.Context.Name._M_dataplus._M_p != &local_f8.Context.Name.field_2) {
      operator_delete(local_f8.Context.Name._M_dataplus._M_p,
                      local_f8.Context.Name.field_2._M_allocated_capacity + 1);
    }
    local_f8.Context.Name._M_dataplus._M_p = (pointer)&local_f8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"WIN32_EXECUTABLE","");
    SetPropertyDefault(this,(string *)&local_f8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8.Context.Name._M_dataplus._M_p != &local_f8.Context.Name.field_2) {
      operator_delete(local_f8.Context.Name._M_dataplus._M_p,
                      local_f8.Context.Name.field_2._M_allocated_capacity + 1);
    }
    local_f8.Context.Name._M_dataplus._M_p = (pointer)&local_f8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"MACOSX_BUNDLE","");
    SetPropertyDefault(this,(string *)&local_f8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8.Context.Name._M_dataplus._M_p != &local_f8.Context.Name.field_2) {
      operator_delete(local_f8.Context.Name._M_dataplus._M_p,
                      local_f8.Context.Name.field_2._M_allocated_capacity + 1);
    }
    local_f8.Context.Name._M_dataplus._M_p = (pointer)&local_f8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"MACOSX_RPATH","");
    SetPropertyDefault(this,(string *)&local_f8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8.Context.Name._M_dataplus._M_p != &local_f8.Context.Name.field_2) {
      operator_delete(local_f8.Context.Name._M_dataplus._M_p,
                      local_f8.Context.Name.field_2._M_allocated_capacity + 1);
    }
    local_f8.Context.Name._M_dataplus._M_p = (pointer)&local_f8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f8,"NO_SYSTEM_FROM_IMPORTED","");
    SetPropertyDefault(this,(string *)&local_f8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8.Context.Name._M_dataplus._M_p != &local_f8.Context.Name.field_2) {
      operator_delete(local_f8.Context.Name._M_dataplus._M_p,
                      local_f8.Context.Name.field_2._M_allocated_capacity + 1);
    }
    local_f8.Context.Name._M_dataplus._M_p = (pointer)&local_f8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"C_COMPILER_LAUNCHER","");
    SetPropertyDefault(this,(string *)&local_f8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8.Context.Name._M_dataplus._M_p != &local_f8.Context.Name.field_2) {
      operator_delete(local_f8.Context.Name._M_dataplus._M_p,
                      local_f8.Context.Name.field_2._M_allocated_capacity + 1);
    }
    local_f8.Context.Name._M_dataplus._M_p = (pointer)&local_f8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"C_INCLUDE_WHAT_YOU_USE","")
    ;
    SetPropertyDefault(this,(string *)&local_f8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8.Context.Name._M_dataplus._M_p != &local_f8.Context.Name.field_2) {
      operator_delete(local_f8.Context.Name._M_dataplus._M_p,
                      local_f8.Context.Name.field_2._M_allocated_capacity + 1);
    }
    local_f8.Context.Name._M_dataplus._M_p = (pointer)&local_f8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"C_STANDARD","");
    SetPropertyDefault(this,(string *)&local_f8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8.Context.Name._M_dataplus._M_p != &local_f8.Context.Name.field_2) {
      operator_delete(local_f8.Context.Name._M_dataplus._M_p,
                      local_f8.Context.Name.field_2._M_allocated_capacity + 1);
    }
    local_f8.Context.Name._M_dataplus._M_p = (pointer)&local_f8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"C_STANDARD_REQUIRED","");
    SetPropertyDefault(this,(string *)&local_f8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8.Context.Name._M_dataplus._M_p != &local_f8.Context.Name.field_2) {
      operator_delete(local_f8.Context.Name._M_dataplus._M_p,
                      local_f8.Context.Name.field_2._M_allocated_capacity + 1);
    }
    local_f8.Context.Name._M_dataplus._M_p = (pointer)&local_f8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"C_EXTENSIONS","");
    SetPropertyDefault(this,(string *)&local_f8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8.Context.Name._M_dataplus._M_p != &local_f8.Context.Name.field_2) {
      operator_delete(local_f8.Context.Name._M_dataplus._M_p,
                      local_f8.Context.Name.field_2._M_allocated_capacity + 1);
    }
    local_f8.Context.Name._M_dataplus._M_p = (pointer)&local_f8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"CXX_COMPILER_LAUNCHER","");
    SetPropertyDefault(this,(string *)&local_f8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8.Context.Name._M_dataplus._M_p != &local_f8.Context.Name.field_2) {
      operator_delete(local_f8.Context.Name._M_dataplus._M_p,
                      local_f8.Context.Name.field_2._M_allocated_capacity + 1);
    }
    local_f8.Context.Name._M_dataplus._M_p = (pointer)&local_f8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f8,"CXX_INCLUDE_WHAT_YOU_USE","");
    SetPropertyDefault(this,(string *)&local_f8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8.Context.Name._M_dataplus._M_p != &local_f8.Context.Name.field_2) {
      operator_delete(local_f8.Context.Name._M_dataplus._M_p,
                      local_f8.Context.Name.field_2._M_allocated_capacity + 1);
    }
    local_f8.Context.Name._M_dataplus._M_p = (pointer)&local_f8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"CXX_STANDARD","");
    SetPropertyDefault(this,(string *)&local_f8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8.Context.Name._M_dataplus._M_p != &local_f8.Context.Name.field_2) {
      operator_delete(local_f8.Context.Name._M_dataplus._M_p,
                      local_f8.Context.Name.field_2._M_allocated_capacity + 1);
    }
    local_f8.Context.Name._M_dataplus._M_p = (pointer)&local_f8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"CXX_STANDARD_REQUIRED","");
    SetPropertyDefault(this,(string *)&local_f8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8.Context.Name._M_dataplus._M_p != &local_f8.Context.Name.field_2) {
      operator_delete(local_f8.Context.Name._M_dataplus._M_p,
                      local_f8.Context.Name.field_2._M_allocated_capacity + 1);
    }
    local_f8.Context.Name._M_dataplus._M_p = (pointer)&local_f8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"CXX_EXTENSIONS","");
    SetPropertyDefault(this,(string *)&local_f8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8.Context.Name._M_dataplus._M_p != &local_f8.Context.Name.field_2) {
      operator_delete(local_f8.Context.Name._M_dataplus._M_p,
                      local_f8.Context.Name.field_2._M_allocated_capacity + 1);
    }
    local_f8.Context.Name._M_dataplus._M_p = (pointer)&local_f8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f8,"LINK_SEARCH_START_STATIC","");
    SetPropertyDefault(this,(string *)&local_f8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8.Context.Name._M_dataplus._M_p != &local_f8.Context.Name.field_2) {
      operator_delete(local_f8.Context.Name._M_dataplus._M_p,
                      local_f8.Context.Name.field_2._M_allocated_capacity + 1);
    }
    local_f8.Context.Name._M_dataplus._M_p = (pointer)&local_f8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"LINK_SEARCH_END_STATIC","")
    ;
    SetPropertyDefault(this,(string *)&local_f8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8.Context.Name._M_dataplus._M_p != &local_f8.Context.Name.field_2) {
      operator_delete(local_f8.Context.Name._M_dataplus._M_p,
                      local_f8.Context.Name.field_2._M_allocated_capacity + 1);
    }
  }
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmMakefile::GetConfigurations(&local_50,mf,&local_88,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((this->TargetTypeValue != UTILITY) &&
     (local_88.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_88.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    s = local_88.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start;
    do {
      cmsys::SystemTools::UpperCase((string *)&local_f8,s);
      ppuVar7 = &PTR_anon_var_dwarf_7867fa_006d5618;
      pcVar6 = "ARCHIVE_OUTPUT_DIRECTORY_";
      do {
        if ((local_b0->TargetTypeValue != INTERFACE_LIBRARY) ||
           (iVar5 = strcmp(pcVar6,"MAP_IMPORTED_CONFIG_"), iVar5 == 0)) {
          std::__cxx11::string::string((string *)&local_a8,pcVar6,&local_b1);
          std::__cxx11::string::_M_append
                    ((char *)&local_a8,(ulong)local_f8.Context.Name._M_dataplus._M_p);
          SetPropertyDefault(local_b0,&local_a8,(char *)0x0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
            operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
          }
        }
        this = local_b0;
        pcVar6 = *ppuVar7;
        ppuVar7 = ppuVar7 + 1;
      } while (pcVar6 != (char *)0x0);
      if ((local_b0->TargetTypeValue != EXECUTABLE) &&
         (local_b0->TargetTypeValue != INTERFACE_LIBRARY)) {
        cmsys::SystemTools::UpperCase(&local_a8,s);
        std::__cxx11::string::append((char *)&local_a8);
        SetPropertyDefault(this,&local_a8,(char *)0x0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8.Context.Name._M_dataplus._M_p != &local_f8.Context.Name.field_2) {
        operator_delete(local_f8.Context.Name._M_dataplus._M_p,
                        local_f8.Context.Name.field_2._M_allocated_capacity + 1);
      }
      s = s + 1;
    } while (s != local_88.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish);
  }
  cmMakefile::GetBacktrace(&local_f8,this->Makefile);
  std::__cxx11::string::_M_assign((string *)&this->Backtrace);
  (this->Backtrace).Context.Line = local_f8.Context.Line;
  (this->Backtrace).Snapshot.State = local_f8.Snapshot.State;
  (this->Backtrace).Snapshot.Position.Tree = local_f8.Snapshot.Position.Tree;
  (this->Backtrace).Snapshot.Position.Position = local_f8.Snapshot.Position.Position;
  cmListFileBacktrace::~cmListFileBacktrace(&local_f8);
  if (this->IsImportedTarget == false) {
    cVar8 = cmMakefile::GetIncludeDirectoriesEntries_abi_cxx11_(this->Makefile);
    cVar9 = cmMakefile::GetIncludeDirectoriesBacktraces(this->Makefile);
    pcVar2 = (this->Internal).Pointer;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pcVar2,
               (pcVar2->IncludeDirectoriesEntries).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,cVar8.Begin._M_current._M_current,
               cVar8.End._M_current._M_current);
    pcVar2 = (this->Internal).Pointer;
    std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<cmListFileBacktrace_const*,std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>>>
              ((vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>> *)
               &pcVar2->IncludeDirectoriesBacktraces,
               (pcVar2->IncludeDirectoriesBacktraces).
               super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>._M_impl
               .super__Vector_impl_data._M_finish,cVar9.Begin._M_current._M_current,
               cVar9.End._M_current._M_current);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_f8,&(this->Makefile->SystemIncludeDirectories)._M_t);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_range_unique<std::_Rb_tree_const_iterator<std::__cxx11::string>>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&this->SystemIncludeDirectories,
               (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )local_f8.Context.Name.field_2._8_8_,
               (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )&local_f8.Context.Name._M_string_length);
    cVar8 = cmMakefile::GetCompileOptionsEntries_abi_cxx11_(this->Makefile);
    cVar9 = cmMakefile::GetCompileOptionsBacktraces(this->Makefile);
    pcVar2 = (this->Internal).Pointer;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &pcVar2->CompileOptionsEntries,
               (pcVar2->CompileOptionsEntries).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,cVar8.Begin._M_current._M_current,
               cVar8.End._M_current._M_current);
    pcVar2 = (this->Internal).Pointer;
    std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<cmListFileBacktrace_const*,std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>>>
              ((vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>> *)
               &pcVar2->CompileOptionsBacktraces,
               (pcVar2->CompileOptionsBacktraces).
               super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>._M_impl
               .super__Vector_impl_data._M_finish,cVar9.Begin._M_current._M_current,
               cVar9.End._M_current._M_current);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_f8);
  }
  if ((this->TargetTypeValue | SHARED_LIBRARY) != INTERFACE_LIBRARY) {
    local_f8.Context.Name._M_dataplus._M_p = (pointer)&local_f8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"C_VISIBILITY_PRESET","");
    SetPropertyDefault(this,(string *)&local_f8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8.Context.Name._M_dataplus._M_p != &local_f8.Context.Name.field_2) {
      operator_delete(local_f8.Context.Name._M_dataplus._M_p,
                      local_f8.Context.Name.field_2._M_allocated_capacity + 1);
    }
    local_f8.Context.Name._M_dataplus._M_p = (pointer)&local_f8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"CXX_VISIBILITY_PRESET","");
    SetPropertyDefault(this,(string *)&local_f8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8.Context.Name._M_dataplus._M_p != &local_f8.Context.Name.field_2) {
      operator_delete(local_f8.Context.Name._M_dataplus._M_p,
                      local_f8.Context.Name.field_2._M_allocated_capacity + 1);
    }
    local_f8.Context.Name._M_dataplus._M_p = (pointer)&local_f8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f8,"VISIBILITY_INLINES_HIDDEN","");
    SetPropertyDefault(this,(string *)&local_f8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8.Context.Name._M_dataplus._M_p != &local_f8.Context.Name.field_2) {
      operator_delete(local_f8.Context.Name._M_dataplus._M_p,
                      local_f8.Context.Name.field_2._M_allocated_capacity + 1);
    }
  }
  if (this->TargetTypeValue == EXECUTABLE) {
    local_f8.Context.Name._M_dataplus._M_p = (pointer)&local_f8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"ANDROID_GUI","");
    SetPropertyDefault(this,(string *)&local_f8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8.Context.Name._M_dataplus._M_p != &local_f8.Context.Name.field_2) {
      operator_delete(local_f8.Context.Name._M_dataplus._M_p,
                      local_f8.Context.Name.field_2._M_allocated_capacity + 1);
    }
    local_f8.Context.Name._M_dataplus._M_p = (pointer)&local_f8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f8,"CROSSCOMPILING_EMULATOR","");
    SetPropertyDefault(this,(string *)&local_f8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8.Context.Name._M_dataplus._M_p != &local_f8.Context.Name.field_2) {
      operator_delete(local_f8.Context.Name._M_dataplus._M_p,
                      local_f8.Context.Name.field_2._M_allocated_capacity + 1);
    }
    local_f8.Context.Name._M_dataplus._M_p = (pointer)&local_f8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"ENABLE_EXPORTS","");
    SetPropertyDefault(this,(string *)&local_f8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8.Context.Name._M_dataplus._M_p != &local_f8.Context.Name.field_2) {
      operator_delete(local_f8.Context.Name._M_dataplus._M_p,
                      local_f8.Context.Name.field_2._M_allocated_capacity + 1);
    }
  }
  if ((this->TargetTypeValue & ~STATIC_LIBRARY) == SHARED_LIBRARY) {
    local_f8.Context.Name._M_dataplus._M_p = (pointer)&local_f8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f8,"POSITION_INDEPENDENT_CODE","");
    SetProperty(this,(string *)&local_f8,"True");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8.Context.Name._M_dataplus._M_p != &local_f8.Context.Name.field_2) {
      operator_delete(local_f8.Context.Name._M_dataplus._M_p,
                      local_f8.Context.Name.field_2._M_allocated_capacity + 1);
    }
  }
  if (this->TargetTypeValue == SHARED_LIBRARY) {
    local_f8.Context.Name._M_dataplus._M_p = (pointer)&local_f8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f8,"WINDOWS_EXPORT_ALL_SYMBOLS","");
    SetPropertyDefault(this,(string *)&local_f8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8.Context.Name._M_dataplus._M_p != &local_f8.Context.Name.field_2) {
      operator_delete(local_f8.Context.Name._M_dataplus._M_p,
                      local_f8.Context.Name.field_2._M_allocated_capacity + 1);
    }
  }
  if ((this->TargetTypeValue | SHARED_LIBRARY) != INTERFACE_LIBRARY) {
    local_f8.Context.Name._M_dataplus._M_p = (pointer)&local_f8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f8,"POSITION_INDEPENDENT_CODE","");
    SetPropertyDefault(this,(string *)&local_f8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8.Context.Name._M_dataplus._M_p != &local_f8.Context.Name.field_2) {
      operator_delete(local_f8.Context.Name._M_dataplus._M_p,
                      local_f8.Context.Name.field_2._M_allocated_capacity + 1);
    }
  }
  cmMakefile::RecordPolicies(this->Makefile,&this->PolicyMap);
  if (this->TargetTypeValue == INTERFACE_LIBRARY) {
    cmPolicies::PolicyMap::Set(&this->PolicyMap,CMP0022,NEW);
  }
  if ((this->TargetTypeValue | SHARED_LIBRARY) != INTERFACE_LIBRARY) {
    local_f8.Context.Name._M_dataplus._M_p = (pointer)&local_f8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"JOB_POOL_COMPILE","");
    SetPropertyDefault(this,(string *)&local_f8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8.Context.Name._M_dataplus._M_p != &local_f8.Context.Name.field_2) {
      operator_delete(local_f8.Context.Name._M_dataplus._M_p,
                      local_f8.Context.Name.field_2._M_allocated_capacity + 1);
    }
    local_f8.Context.Name._M_dataplus._M_p = (pointer)&local_f8.Context.Name.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"JOB_POOL_LINK","");
    SetPropertyDefault(this,(string *)&local_f8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8.Context.Name._M_dataplus._M_p != &local_f8.Context.Name.field_2) {
      operator_delete(local_f8.Context.Name._M_dataplus._M_p,
                      local_f8.Context.Name.field_2._M_allocated_capacity + 1);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88);
  return;
}

Assistant:

void cmTarget::SetMakefile(cmMakefile* mf)
{
  // Set our makefile.
  this->Makefile = mf;

  // Check whether this is a DLL platform.
  this->DLLPlatform = (this->Makefile->IsOn("WIN32") ||
                       this->Makefile->IsOn("CYGWIN") ||
                       this->Makefile->IsOn("MINGW"));

  // Check whether we are targeting an Android platform.
  this->IsAndroid =
    strcmp(this->Makefile->GetSafeDefinition("CMAKE_SYSTEM_NAME"),
           "Android") == 0;

  // Setup default property values.
  if (this->GetType() != cmState::INTERFACE_LIBRARY
      && this->GetType() != cmState::UTILITY)
    {
    this->SetPropertyDefault("ANDROID_API", 0);
    this->SetPropertyDefault("ANDROID_API_MIN", 0);
    this->SetPropertyDefault("ANDROID_ARCH", 0);
    this->SetPropertyDefault("ANDROID_STL_TYPE", 0);
    this->SetPropertyDefault("ANDROID_SKIP_ANT_STEP", 0);
    this->SetPropertyDefault("ANDROID_PROCESS_MAX", 0);
    this->SetPropertyDefault("ANDROID_PROGUARD", 0);
    this->SetPropertyDefault("ANDROID_PROGUARD_CONFIG_PATH", 0);
    this->SetPropertyDefault("ANDROID_SECURE_PROPS_PATH", 0);
    this->SetPropertyDefault("ANDROID_NATIVE_LIB_DIRECTORIES", 0);
    this->SetPropertyDefault("ANDROID_NATIVE_LIB_DEPENDENCIES", 0);
    this->SetPropertyDefault("ANDROID_JAVA_SOURCE_DIR", 0);
    this->SetPropertyDefault("ANDROID_JAR_DIRECTORIES", 0);
    this->SetPropertyDefault("ANDROID_JAR_DEPENDENCIES", 0);
    this->SetPropertyDefault("ANDROID_ASSETS_DIRECTORIES", 0);
    this->SetPropertyDefault("ANDROID_ANT_ADDITIONAL_OPTIONS", 0);
    this->SetPropertyDefault("INSTALL_NAME_DIR", 0);
    this->SetPropertyDefault("INSTALL_RPATH", "");
    this->SetPropertyDefault("INSTALL_RPATH_USE_LINK_PATH", "OFF");
    this->SetPropertyDefault("SKIP_BUILD_RPATH", "OFF");
    this->SetPropertyDefault("BUILD_WITH_INSTALL_RPATH", "OFF");
    this->SetPropertyDefault("ARCHIVE_OUTPUT_DIRECTORY", 0);
    this->SetPropertyDefault("LIBRARY_OUTPUT_DIRECTORY", 0);
    this->SetPropertyDefault("RUNTIME_OUTPUT_DIRECTORY", 0);
    this->SetPropertyDefault("PDB_OUTPUT_DIRECTORY", 0);
    this->SetPropertyDefault("COMPILE_PDB_OUTPUT_DIRECTORY", 0);
    this->SetPropertyDefault("Fortran_FORMAT", 0);
    this->SetPropertyDefault("Fortran_MODULE_DIRECTORY", 0);
    this->SetPropertyDefault("GNUtoMS", 0);
    this->SetPropertyDefault("OSX_ARCHITECTURES", 0);
    this->SetPropertyDefault("IOS_INSTALL_COMBINED", 0);
    this->SetPropertyDefault("AUTOMOC", 0);
    this->SetPropertyDefault("AUTOUIC", 0);
    this->SetPropertyDefault("AUTORCC", 0);
    this->SetPropertyDefault("AUTOMOC_MOC_OPTIONS", 0);
    this->SetPropertyDefault("AUTOUIC_OPTIONS", 0);
    this->SetPropertyDefault("AUTORCC_OPTIONS", 0);
    this->SetPropertyDefault("LINK_DEPENDS_NO_SHARED", 0);
    this->SetPropertyDefault("LINK_INTERFACE_LIBRARIES", 0);
    this->SetPropertyDefault("WIN32_EXECUTABLE", 0);
    this->SetPropertyDefault("MACOSX_BUNDLE", 0);
    this->SetPropertyDefault("MACOSX_RPATH", 0);
    this->SetPropertyDefault("NO_SYSTEM_FROM_IMPORTED", 0);
    this->SetPropertyDefault("C_COMPILER_LAUNCHER", 0);
    this->SetPropertyDefault("C_INCLUDE_WHAT_YOU_USE", 0);
    this->SetPropertyDefault("C_STANDARD", 0);
    this->SetPropertyDefault("C_STANDARD_REQUIRED", 0);
    this->SetPropertyDefault("C_EXTENSIONS", 0);
    this->SetPropertyDefault("CXX_COMPILER_LAUNCHER", 0);
    this->SetPropertyDefault("CXX_INCLUDE_WHAT_YOU_USE", 0);
    this->SetPropertyDefault("CXX_STANDARD", 0);
    this->SetPropertyDefault("CXX_STANDARD_REQUIRED", 0);
    this->SetPropertyDefault("CXX_EXTENSIONS", 0);
    this->SetPropertyDefault("LINK_SEARCH_START_STATIC", 0);
    this->SetPropertyDefault("LINK_SEARCH_END_STATIC", 0);
    }

  // Collect the set of configuration types.
  std::vector<std::string> configNames;
  mf->GetConfigurations(configNames);

  // Setup per-configuration property default values.
  if (this->GetType() != cmState::UTILITY)
    {
    const char* configProps[] = {
      "ARCHIVE_OUTPUT_DIRECTORY_",
      "LIBRARY_OUTPUT_DIRECTORY_",
      "RUNTIME_OUTPUT_DIRECTORY_",
      "PDB_OUTPUT_DIRECTORY_",
      "COMPILE_PDB_OUTPUT_DIRECTORY_",
      "MAP_IMPORTED_CONFIG_",
      0};
    for(std::vector<std::string>::iterator ci = configNames.begin();
        ci != configNames.end(); ++ci)
      {
      std::string configUpper = cmSystemTools::UpperCase(*ci);
      for(const char** p = configProps; *p; ++p)
        {
        if (this->TargetTypeValue == cmState::INTERFACE_LIBRARY
            && strcmp(*p, "MAP_IMPORTED_CONFIG_") != 0)
          {
          continue;
          }
        std::string property = *p;
        property += configUpper;
        this->SetPropertyDefault(property, 0);
        }

      // Initialize per-configuration name postfix property from the
      // variable only for non-executable targets.  This preserves
      // compatibility with previous CMake versions in which executables
      // did not support this variable.  Projects may still specify the
      // property directly.
      if(this->TargetTypeValue != cmState::EXECUTABLE
          && this->TargetTypeValue != cmState::INTERFACE_LIBRARY)
        {
        std::string property = cmSystemTools::UpperCase(*ci);
        property += "_POSTFIX";
        this->SetPropertyDefault(property, 0);
        }
      }
    }

  // Save the backtrace of target construction.
  this->Backtrace = this->Makefile->GetBacktrace();

  if (!this->IsImported())
    {
    // Initialize the INCLUDE_DIRECTORIES property based on the current value
    // of the same directory property:
    const cmStringRange parentIncludes =
        this->Makefile->GetIncludeDirectoriesEntries();
    const cmBacktraceRange parentIncludesBts =
        this->Makefile->GetIncludeDirectoriesBacktraces();

    this->Internal->IncludeDirectoriesEntries.insert(
          this->Internal->IncludeDirectoriesEntries.end(),
          parentIncludes.begin(), parentIncludes.end());
    this->Internal->IncludeDirectoriesBacktraces.insert(
          this->Internal->IncludeDirectoriesBacktraces.end(),
          parentIncludesBts.begin(), parentIncludesBts.end());

    const std::set<std::string> parentSystemIncludes =
                                this->Makefile->GetSystemIncludeDirectories();

    this->SystemIncludeDirectories.insert(parentSystemIncludes.begin(),
                                          parentSystemIncludes.end());

    const cmStringRange parentOptions =
                                this->Makefile->GetCompileOptionsEntries();
    const cmBacktraceRange parentOptionsBts =
                                this->Makefile->GetCompileOptionsBacktraces();

    this->Internal->CompileOptionsEntries.insert(
          this->Internal->CompileOptionsEntries.end(),
          parentOptions.begin(), parentOptions.end());
    this->Internal->CompileOptionsBacktraces.insert(
          this->Internal->CompileOptionsBacktraces.end(),
          parentOptionsBts.begin(), parentOptionsBts.end());
    }

  if (this->GetType() != cmState::INTERFACE_LIBRARY
      && this->GetType() != cmState::UTILITY)
    {
    this->SetPropertyDefault("C_VISIBILITY_PRESET", 0);
    this->SetPropertyDefault("CXX_VISIBILITY_PRESET", 0);
    this->SetPropertyDefault("VISIBILITY_INLINES_HIDDEN", 0);
    }

  if(this->TargetTypeValue == cmState::EXECUTABLE)
    {
    this->SetPropertyDefault("ANDROID_GUI", 0);
    this->SetPropertyDefault("CROSSCOMPILING_EMULATOR", 0);
    this->SetPropertyDefault("ENABLE_EXPORTS", 0);
    }
  if(this->TargetTypeValue == cmState::SHARED_LIBRARY
      || this->TargetTypeValue == cmState::MODULE_LIBRARY)
    {
    this->SetProperty("POSITION_INDEPENDENT_CODE", "True");
    }
  if(this->TargetTypeValue == cmState::SHARED_LIBRARY)
    {
    this->SetPropertyDefault("WINDOWS_EXPORT_ALL_SYMBOLS", 0);
    }

  if (this->GetType() != cmState::INTERFACE_LIBRARY
      && this->GetType() != cmState::UTILITY)
    {
    this->SetPropertyDefault("POSITION_INDEPENDENT_CODE", 0);
    }

  // Record current policies for later use.
  this->Makefile->RecordPolicies(this->PolicyMap);

  if (this->TargetTypeValue == cmState::INTERFACE_LIBRARY)
    {
    // This policy is checked in a few conditions. The properties relevant
    // to the policy are always ignored for cmState::INTERFACE_LIBRARY targets,
    // so ensure that the conditions don't lead to nonsense.
    this->PolicyMap.Set(cmPolicies::CMP0022, cmPolicies::NEW);
    }

  if (this->GetType() != cmState::INTERFACE_LIBRARY
      && this->GetType() != cmState::UTILITY)
    {
    this->SetPropertyDefault("JOB_POOL_COMPILE", 0);
    this->SetPropertyDefault("JOB_POOL_LINK", 0);
    }
}